

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::name2dataaddress(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  char cVar1;
  pointer plVar2;
  pointer plVar3;
  __type_conflict _Var4;
  uint uVar5;
  uint src;
  size_type sVar6;
  int in_ESI;
  char cVar7;
  __normal_iterator<cppforth::Forth::localVariable_*,_std::vector<cppforth::Forth::localVariable,_std::allocator<cppforth::Forth::localVariable>_>_>
  __tmp;
  pointer plVar8;
  string localName;
  string local_50;
  
  bl(this);
  word(this);
  if ((this->localVariables).
      super__Vector_base<cppforth::Forth::localVariable,_std::allocator<cppforth::Forth::localVariable>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->localVariables).
      super__Vector_base<cppforth::Forth::localVariable,_std::allocator<cppforth::Forth::localVariable>_>
      ._M_impl.super__Vector_impl_data._M_start) {
LAB_001147f8:
    find(this);
    drop(this);
    toBody(this);
  }
  else {
    dup(this,in_ESI);
    count(this);
    this_00 = &this->dStack;
    uVar5 = ForthStack<unsigned_int>::getTop(this_00);
    ForthStack<unsigned_int>::pop(this_00);
    src = ForthStack<unsigned_int>::getTop(this_00);
    ForthStack<unsigned_int>::pop(this_00);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    moveFromDataSpace(this,&local_50,src,(ulong)uVar5);
    for (sVar6 = 0; local_50._M_string_length != sVar6; sVar6 = sVar6 + 1) {
      cVar1 = local_50._M_dataplus._M_p[sVar6];
      cVar7 = cVar1 + -0x20;
      if (0x19 < (byte)(cVar1 + 0x9fU)) {
        cVar7 = cVar1;
      }
      local_50._M_dataplus._M_p[sVar6] = cVar7;
    }
    plVar2 = (this->localVariables).
             super__Vector_base<cppforth::Forth::localVariable,_std::allocator<cppforth::Forth::localVariable>_>
             ._M_impl.super__Vector_impl_data._M_start;
    plVar3 = (this->localVariables).
             super__Vector_base<cppforth::Forth::localVariable,_std::allocator<cppforth::Forth::localVariable>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    do {
      plVar8 = plVar3;
      if (plVar8 == plVar2) {
        std::__cxx11::string::~string((string *)&local_50);
        goto LAB_001147f8;
      }
      _Var4 = std::operator==(&plVar8[-1].localName,&local_50);
      plVar3 = plVar8 + -1;
    } while (!_Var4);
    ForthStack<unsigned_int>::setTop(this_00,plVar8[-1].localAddress);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void name2dataaddress(){
			bl();word();
			if(localVariables.size()>0){
				dup();
				count();
				auto u=dStack.getTop(); dStack.pop();
				auto address=dStack.getTop(); dStack.pop();
				std::string localName{};
				moveFromDataSpace(localName,address,u);
				for(auto &c: localName) c=toupper_ascii(c);
				for(auto it=localVariables.rbegin(),itEnd=localVariables.rend();it!=itEnd;++it){
					if((*it).localName==localName){
						dStack.setTop((*it).localAddress);
						return;
					}
				}		
			} 
			find();drop();toBody();
			
		}